

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O0

void __thiscall Amiga::Chipset::Chipset(Chipset *this,MemoryMap *map,int input_clock_rate)

{
  uint16_t *puVar1;
  size_type sVar2;
  Joystick *pJVar3;
  uint16_t *local_138;
  uint16_t *local_128;
  Rect local_50;
  Joystick *local_40;
  Cycles local_38 [3];
  int local_1c;
  MemoryMap *pMStack_18;
  int input_clock_rate_local;
  MemoryMap *map_local;
  Chipset *this_local;
  
  local_1c = input_clock_rate;
  pMStack_18 = map;
  map_local = (MemoryMap *)this;
  ClockingHint::Observer::Observer(&this->super_Observer);
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_component_prefers_clocking_00c98080
  ;
  HalfCycles::HalfCycles(&this->cia_divider_);
  HalfCycles::HalfCycles(&this->keyboard_divider_);
  this->interrupt_enable_ = 0;
  this->interrupt_requests_ = 0;
  this->interrupt_level_ = 0;
  this->dma_control_ = 0;
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Blitter<false>::DMADeviceBase(&this->blitter_,this,puVar1,sVar2 >> 1);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Sprite::DMADeviceBase((this->sprites_)._M_elems,this,puVar1,sVar2 >> 1);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Sprite::DMADeviceBase((this->sprites_)._M_elems + 1,this,puVar1,sVar2 >> 1);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Sprite::DMADeviceBase((this->sprites_)._M_elems + 2,this,puVar1,sVar2 >> 1);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Sprite::DMADeviceBase((this->sprites_)._M_elems + 3,this,puVar1,sVar2 >> 1);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Sprite::DMADeviceBase((this->sprites_)._M_elems + 4,this,puVar1,sVar2 >> 1);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Sprite::DMADeviceBase((this->sprites_)._M_elems + 5,this,puVar1,sVar2 >> 1);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Sprite::DMADeviceBase((this->sprites_)._M_elems + 6,this,puVar1,sVar2 >> 1);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Sprite::DMADeviceBase((this->sprites_)._M_elems + 7,this,puVar1,sVar2 >> 1);
  this->collisions_ = 0;
  this->collisions_flags_ = 0;
  this->playfield_collision_mask_ = 0;
  this->playfield_collision_complement_ = 0;
  this->line_length_ = 0xe3;
  this->short_field_height_ = 0x138;
  this->vertical_blank_height_ = 0x19;
  this->line_cycle_ = 0;
  this->y_ = 0;
  this->display_window_start_[0] = 0;
  this->display_window_start_[1] = 0;
  this->display_window_stop_[0] = 0;
  this->display_window_stop_[1] = 0;
  this->fetch_window_[0] = 0;
  this->fetch_window_[1] = 0;
  this->fetch_vertical_ = false;
  this->display_horizontal_ = false;
  this->did_fetch_ = false;
  this->horizontal_offset_ = 0;
  this->horizontal_fetch_ = Stopped;
  this->border_colour_ = 0;
  this->is_border_ = true;
  this->zone_duration_ = 0;
  this->pixels_ = (uint16_t *)0x0;
  this->last_colour_ = 0;
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Bitplanes::DMADeviceBase(&this->bitplanes_,this,puVar1,sVar2 >> 1);
  this->has_next_bitplanes_ = false;
  this->odd_priority_ = 0;
  this->even_priority_ = 0;
  this->even_over_odd_ = false;
  this->hold_and_modify_ = false;
  this->dual_playfields_ = false;
  this->interlace_ = false;
  this->is_long_field_ = false;
  BitplaneShifter::BitplaneShifter(&this->bitplane_pixels_);
  this->odd_delay_ = 0;
  this->even_delay_ = 0;
  this->is_high_res_ = false;
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Copper::DMADeviceBase(&this->copper_,this,puVar1,sVar2 >> 1);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  Audio::Audio(&this->audio_,this,puVar1,sVar2 >> 1,(float)local_1c * 0.5);
  Outputs::CRT::CRT::CRT(&this->crt_,0x38c,4,PAL50,Red4Green4Blue4);
  local_128 = this->palette_;
  do {
    *local_128 = 0;
    local_128 = local_128 + 1;
  } while (local_128 != this->swizzled_palette_);
  local_138 = this->swizzled_palette_;
  do {
    *local_138 = 0;
    local_138 = local_138 + 1;
  } while ((Mouse *)local_138 != &this->mouse_);
  Mouse::Mouse(&this->mouse_);
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::vector(&this->joysticks_);
  CIAAHandler::CIAAHandler(&this->cia_a_handler_,pMStack_18,&this->disk_controller_,&this->mouse_);
  CIABHandler::CIABHandler(&this->cia_b_handler_,&this->disk_controller_);
  MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::MOS6526
            (&this->cia_a,&this->cia_a_handler_);
  MOS::MOS6526::MOS6526<Amiga::Chipset::CIABHandler,_(MOS::MOS6526::Personality)1>::MOS6526
            (&this->cia_b,&this->cia_b_handler_);
  puVar1 = (uint16_t *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pMStack_18->chip_ram);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pMStack_18->chip_ram);
  DiskDMA::DMADeviceBase(&this->disk_,this,puVar1,sVar2 >> 1);
  Cycles::Cycles(local_38,(long)local_1c);
  DiskController::DiskController(&this->disk_controller_,local_38[0],this,&this->disk_,&this->cia_b)
  ;
  this->disk_controller_is_sleeping_ = false;
  this->paula_disk_control_ = 0;
  Amiga::Keyboard::Keyboard(&this->keyboard_,&(this->cia_a).serial_input);
  ClockingHint::Source::set_clocking_hint_observer
            ((Source *)&this->disk_controller_,&this->super_Observer);
  pJVar3 = (Joystick *)operator_new(0x58);
  Amiga::Joystick::Joystick(pJVar3);
  local_40 = pJVar3;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<Amiga::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,&local_40);
  pJVar3 = joystick(this,0);
  CIAAHandler::set_joystick(&this->cia_a_handler_,pJVar3);
  Outputs::Display::Rect::Rect(&local_50,0.05,0.055,0.88,0.88);
  Outputs::CRT::CRT::set_visible_area(&this->crt_,local_50);
  return;
}

Assistant:

Chipset::Chipset(MemoryMap &map, int input_clock_rate) :
	blitter_(DMA_CONSTRUCT),
	sprites_{
		Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},
		Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT}
	},
	bitplanes_(DMA_CONSTRUCT),
	copper_(DMA_CONSTRUCT),
	audio_(DMA_CONSTRUCT, float(input_clock_rate / 2.0)),
	crt_(908, 4, Outputs::Display::Type::PAL50, Outputs::Display::InputDataType::Red4Green4Blue4),
	cia_a_handler_(map, disk_controller_, mouse_),
	cia_b_handler_(disk_controller_),
	cia_a(cia_a_handler_),
	cia_b(cia_b_handler_),
	disk_(DMA_CONSTRUCT),
	disk_controller_(Cycles(input_clock_rate), *this, disk_, cia_b),
	keyboard_(cia_a.serial_input) {
	disk_controller_.set_clocking_hint_observer(this);

	joysticks_.emplace_back(new Joystick());
	cia_a_handler_.set_joystick(&joystick(0));

	// Very conservatively crop, to roughly the centre 88% of a frame.
	// This rectange was specifically calibrated around the default Workbench display.
	crt_.set_visible_area(Outputs::Display::Rect(0.05f, 0.055f, 0.88f, 0.88f));
}